

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O1

void __thiscall Assimp::JSONWriter::SimpleValue(JSONWriter *this,void *buffer,size_t len)

{
  int iVar1;
  int iVar2;
  char *cur;
  char *code_out;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  ulong uVar6;
  base64_encodestate s;
  char local_35;
  base64_encodestate local_34;
  
  base64_init_encodestate(&local_34);
  uVar6 = 0x10;
  if (0x10 < len * 2) {
    uVar6 = len * 2;
  }
  code_out = (char *)operator_new__(uVar6);
  iVar1 = base64_encode_block((char *)buffer,(int)len,code_out,&local_34);
  iVar2 = base64_encode_blockend(code_out + iVar1,&local_34);
  code_out[iVar1 + iVar2] = '\0';
  pcVar3 = code_out;
  do {
    if (*pcVar3 == '\n') {
      *pcVar3 = ' ';
    }
    else if (*pcVar3 == '\0') {
      local_35 = '\"';
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&this->field_0x58,&local_35,1);
      sVar5 = strlen(code_out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,code_out,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
      operator_delete__(code_out);
      return;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

void SimpleValue(const void* buffer, size_t len) {
        base64_encodestate s;
        base64_init_encodestate(&s);

        char* const out = new char[std::max(len * 2, static_cast<size_t>(16u))];
        const int n = base64_encode_block(reinterpret_cast<const char*>(buffer), static_cast<int>(len), out, &s);
        out[n + base64_encode_blockend(out + n, &s)] = '\0';

        // base64 encoding may add newlines, but JSON strings may not contain 'real' newlines
        // (only escaped ones). Remove any newlines in out.
        for (char* cur = out; *cur; ++cur) {
            if (*cur == '\n') {
                *cur = ' ';
            }
        }

        buff << '\"' << out << "\"\n";
        delete[] out;
    }